

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void anon_unknown.dwarf_f94903::sync(void)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  PCMSegment *in_RDI;
  int local_30;
  int c;
  int local_14;
  int bit_size_local;
  int length_local;
  PCMSegment *segment;
  
  Storage::Disk::PCMSegment::PCMSegment(in_RDI);
  std::vector<bool,_std::allocator<bool>_>::reserve(&in_RDI->data,(long)(in_ESI * in_EDX));
  local_14 = in_ESI;
  while (iVar1 = local_14 + -1, local_14 != 0) {
    local_30 = 8;
    while (local_30 != 0) {
      std::vector<bool,_std::allocator<bool>_>::push_back(&in_RDI->data,true);
      local_30 = local_30 + -1;
    }
    local_30 = in_EDX + -8;
    while (local_14 = iVar1, local_30 != 0) {
      std::vector<bool,_std::allocator<bool>_>::push_back(&in_RDI->data,false);
      local_30 = local_30 + -1;
    }
  }
  return;
}

Assistant:

Storage::Disk::PCMSegment sync(int length, int bit_size) {
	Storage::Disk::PCMSegment segment;

	// Reserve sufficient storage.
	segment.data.reserve(size_t(length * bit_size));

	// Write patterns of 0xff padded with 0s to the selected bit size.
	while(length--) {
		int c = 8;
		while(c--)
			segment.data.push_back(true);

		c = bit_size - 8;
		while(c--)
			segment.data.push_back(false);
	}

	return segment;
}